

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestUploadCommand.cxx
# Opt level: O0

bool __thiscall cmCTestUploadCommand::CheckArgumentKeyword(cmCTestUploadCommand *this,string *arg)

{
  bool bVar1;
  string *arg_local;
  cmCTestUploadCommand *this_local;
  
  bVar1 = std::operator==(arg,"FILES");
  if (bVar1) {
    (this->super_cmCTestHandlerCommand).ArgumentDoing = 3;
    this_local._7_1_ = true;
  }
  else {
    bVar1 = std::operator==(arg,"QUIET");
    if (bVar1) {
      (this->super_cmCTestHandlerCommand).ArgumentDoing = 0;
      (this->super_cmCTestHandlerCommand).Quiet = true;
      this_local._7_1_ = true;
    }
    else {
      bVar1 = std::operator==(arg,"CAPTURE_CMAKE_ERROR");
      if (bVar1) {
        (this->super_cmCTestHandlerCommand).ArgumentDoing = 4;
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool cmCTestUploadCommand::CheckArgumentKeyword(std::string const& arg)
{
  if (arg == "FILES") {
    this->ArgumentDoing = ArgumentDoingFiles;
    return true;
  }
  if (arg == "QUIET") {
    this->ArgumentDoing = ArgumentDoingNone;
    this->Quiet = true;
    return true;
  }
  if (arg == "CAPTURE_CMAKE_ERROR") {
    this->ArgumentDoing = ArgumentDoingCaptureCMakeError;
    return true;
  }
  return false;
}